

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

int HighFreqSub::pipeController(zloop_t *loop,zsock_t *reader,void *arg)

{
  _Bool _Var1;
  char *endpoints;
  HighFreqDataType *this;
  long *in_RDX;
  void *in_RSI;
  zloop_t *in_RDI;
  HighFreqSub *self;
  zframe_t *f;
  HighFreqSub *in_stack_fffffffffffffef8;
  string local_50 [32];
  long *local_30;
  zframe_t *local_28;
  long *local_20;
  void *local_18;
  zloop_t *local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = zframe_recv(in_RSI);
  local_30 = local_20;
  _Var1 = zframe_streq(local_28,"$TERM");
  if (_Var1) {
    local_4 = -1;
  }
  else {
    _Var1 = zframe_streq(local_28,"$DRG");
    if (_Var1) {
      zloop_reader_end(local_10,(zsock_t *)local_30[0x15]);
      zsock_destroy_checked
                ((zsock_t **)(local_30 + 0x15),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                 ,0x7c);
      zstr_send(local_18,"$DRGD");
    }
    else {
      _Var1 = zframe_streq(local_28,"$REG");
      if (_Var1) {
        if (local_30[0x15] == 0) {
          getType(in_stack_fffffffffffffef8);
          HighFreqDataType::getSockAddr_abi_cxx11_((HighFreqDataType *)in_stack_fffffffffffffef8);
          endpoints = (char *)std::__cxx11::string::c_str();
          this = (HighFreqDataType *)
                 zsock_new_sub_checked
                           (endpoints,"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                            ,0x81);
          local_30[0x15] = (long)this;
          std::__cxx11::string::~string(local_50);
          HighFreqDataType::~HighFreqDataType(this);
        }
        (**(code **)(*local_30 + 0x20))(local_30,local_10);
        zstr_send(local_18,"$REGD");
      }
      else {
        (**(code **)(*local_30 + 0x18))(local_30,local_10,local_18,local_28);
      }
    }
    zframe_destroy(&local_28);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int HighFreqSub::pipeController(zloop_t *loop, zsock_t *reader, void *arg){
    zframe_t *f = zframe_recv(reader);
    HighFreqSub *self = (HighFreqSub*)arg;
    if(zframe_streq(f, "$TERM")){
        return -1;
    }
    else if(zframe_streq(f, deregdt)){
        zloop_reader_end(loop, self->sub);
        zsock_destroy(&self->sub);
        zstr_send(reader, deregdone);
    }
    else if(zframe_streq(f, regdt)){
        if(!self->sub)
            self->sub = zsock_new_sub(self->getType().getSockAddr().c_str(), "");
        self->sub_reader(loop);
        zstr_send(reader, regdone);
    }
    else{
        self->customCommands(loop, reader, f);
    }
    zframe_destroy(&f);
    return 0;
}